

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O3

CommandOptions * read_isxd_file(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Result_t *pRVar9;
  Result_t *pRVar10;
  MDD_t MVar11;
  undefined8 uVar12;
  long *plVar13;
  long *plVar14;
  AESDecContext *this;
  HMACContext *this_00;
  size_t sVar15;
  IFileReaderFactory *in_RDX;
  uint uVar16;
  uint uVar17;
  bool bVar18;
  MXFReader Reader;
  ui32_t write_count;
  FrameBuffer FrameBuffer;
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  object_list;
  FileWriter OutFile;
  char name_format [64];
  MXFReader local_358 [16];
  long *local_348 [2];
  long local_338 [2];
  undefined8 local_328;
  IFileReaderFactory *local_320;
  FrameBuffer local_310 [8];
  uint *local_308;
  undefined1 local_2e8 [16];
  long local_2d8 [6];
  bool local_2a7;
  _Alloc_hider local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  _Alloc_hider local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  _Alloc_hider local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250 [6];
  FileWriter local_1e8 [56];
  allocator<char> local_1b0 [104];
  char local_148 [72];
  undefined1 local_100 [208];
  
  AS_02::ISXD::MXFReader::MXFReader(local_358,in_RDX);
  ASDCP::FrameBuffer::FrameBuffer(local_310);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2e8,(char *)fileReaderFactory[0xb]._vptr_IFileReaderFactory,local_1b0);
  AS_02::ISXD::MXFReader::OpenRead((string *)Options);
  if ((Result_t *)local_2e8._0_8_ != (Result_t *)local_2d8) {
    operator_delete((void *)local_2e8._0_8_,local_2d8[0] + 1);
  }
  iVar1._0_1_ = Options->error_flag;
  iVar1._1_1_ = Options->key_flag;
  iVar1._2_1_ = Options->read_hmac;
  iVar1._3_1_ = Options->split_wav;
  if (iVar1 < 0) {
    uVar12 = 0;
  }
  else {
    ASDCP::FrameBuffer::Capacity((uint)local_2e8);
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_2e8);
    Kumu::Result_t::~Result_t((Result_t *)local_2e8);
    AS_02::ISXD::MXFReader::AS02IndexReader();
    uVar12 = AS_02::MXF::AS02IndexReader::GetDuration();
    iVar2._0_1_ = Options->error_flag;
    iVar2._1_1_ = Options->key_flag;
    iVar2._2_1_ = Options->read_hmac;
    iVar2._3_1_ = Options->split_wav;
    if (-1 < iVar2) {
      local_2d8[0] = 0;
      local_328 = uVar12;
      local_320 = fileReaderFactory;
      local_2e8._0_8_ = (Result_t *)local_2e8;
      local_2e8._8_8_ = (Result_t *)local_2e8;
      plVar13 = (long *)AS_02::ISXD::MXFReader::OP1aHeader();
      MVar11 = ASDCP::DefaultSMPTEDict();
      uVar12 = ASDCP::Dictionary::Type(MVar11);
      (**(code **)(*plVar13 + 0xb0))(local_100 + 0x68,plVar13,uVar12,local_2e8);
      Kumu::Result_t::~Result_t((Result_t *)(local_100 + 0x68));
      plVar13 = (long *)local_2e8;
      while (plVar13 = (long *)*plVar13, plVar13 != (long *)local_2e8) {
        if ((plVar13[2] == 0) ||
           (plVar14 = (long *)__dynamic_cast(plVar13[2],&ASDCP::MXF::InterchangeObject::typeinfo,
                                             &ASDCP::MXF::GenericStreamTextBasedSet::typeinfo,0),
           plVar14 == (long *)0x0)) {
          __assert_fail("text_object",
                        "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/as-02-unwrap.cpp"
                        ,0x387,
                        "Result_t read_isxd_file(CommandOptions &, const Kumu::IFileReaderFactory &)"
                       );
        }
        (**(code **)(*plVar14 + 0x88))(plVar14,_stderr);
      }
      uVar12 = local_328;
      fileReaderFactory = local_320;
      pRVar10 = (Result_t *)local_2e8._0_8_;
      while (local_328 = uVar12, local_320 = fileReaderFactory, pRVar10 != (Result_t *)local_2e8) {
        pRVar9 = *(Result_t **)pRVar10;
        operator_delete(pRVar10,0x18);
        uVar12 = local_328;
        fileReaderFactory = local_320;
        pRVar10 = pRVar9;
      }
      iVar3._0_1_ = Options->error_flag;
      iVar3._1_1_ = Options->key_flag;
      iVar3._2_1_ = Options->read_hmac;
      iVar3._3_1_ = Options->split_wav;
      uVar16 = (uint)uVar12;
      if ((-1 < iVar3) &&
         (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 1) == '\x01')) {
        this = (AESDecContext *)operator_new(8);
        ASDCP::AESDecContext::AESDecContext(this);
        ASDCP::AESDecContext::InitKey(local_2e8);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_2e8);
        Kumu::Result_t::~Result_t((Result_t *)local_2e8);
        iVar4._0_1_ = Options->error_flag;
        iVar4._1_1_ = Options->key_flag;
        iVar4._2_1_ = Options->read_hmac;
        iVar4._3_1_ = Options->split_wav;
        if ((-1 < iVar4) &&
           (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 2) == '\x01')) {
          ASDCP::WriterInfo::WriterInfo((WriterInfo *)local_2e8);
          AS_02::ISXD::MXFReader::FillWriterInfo((WriterInfo *)local_100);
          Kumu::Result_t::~Result_t((Result_t *)local_100);
          if (local_2a7 == true) {
            this_00 = (HMACContext *)operator_new(8);
            ASDCP::HMACContext::HMACContext(this_00);
            ASDCP::HMACContext::InitKey((uchar *)local_1b0,(LabelSet_t)this_00);
            Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_1b0);
            Kumu::Result_t::~Result_t((Result_t *)local_1b0);
          }
          else {
            read_isxd_file();
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_p != local_250) {
            operator_delete(local_260._M_p,local_250[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_p != &local_270) {
            operator_delete(local_280._M_p,local_270._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_p != &local_290) {
            operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
          }
        }
        goto LAB_0010a7e6;
      }
    }
  }
  uVar16 = (uint)uVar12;
LAB_0010a7e6:
  uVar17 = *(uint *)&fileReaderFactory[3]._vptr_IFileReaderFactory;
  if (*(uint *)&fileReaderFactory[3]._vptr_IFileReaderFactory == 0) {
    uVar17 = uVar16;
  }
  uVar17 = uVar17 + *(int *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
  if (uVar16 <= uVar17) {
    uVar17 = uVar16;
  }
  snprintf(local_148,0x40,"%%s%%0%du.%s",
           (ulong)*(uint *)&fileReaderFactory[2]._vptr_IFileReaderFactory,
           fileReaderFactory[0xc]._vptr_IFileReaderFactory);
  iVar5._0_1_ = Options->error_flag;
  iVar5._1_1_ = Options->key_flag;
  iVar5._2_1_ = Options->read_hmac;
  iVar5._3_1_ = Options->split_wav;
  if ((-1 < iVar5) &&
     (uVar16 = *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4), uVar16 < uVar17)
     ) {
    while( true ) {
      AS_02::ISXD::MXFReader::ReadFrame
                ((uint)(Result_t *)local_2e8,(FrameBuffer *)local_358,(AESDecContext *)(ulong)uVar16
                 ,(HMACContext *)local_310);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_2e8);
      Kumu::Result_t::~Result_t((Result_t *)local_2e8);
      iVar6._0_1_ = Options->error_flag;
      iVar6._1_1_ = Options->key_flag;
      iVar6._2_1_ = Options->read_hmac;
      iVar6._3_1_ = Options->split_wav;
      if (iVar6 < 0) break;
      bVar18 = true;
      if (*(char *)((long)&fileReaderFactory[1]._vptr_IFileReaderFactory + 4) == '\0') {
        Kumu::FileWriter::FileWriter(local_1e8);
        snprintf((char *)local_2e8,0x100,local_148,fileReaderFactory[6]._vptr_IFileReaderFactory,
                 (ulong)uVar16);
        local_348[0] = local_338;
        sVar15 = strlen((char *)local_2e8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_348,(Result_t *)local_2e8,local_2e8 + sVar15);
        Kumu::FileWriter::OpenWrite((string *)local_1b0);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_1b0);
        Kumu::Result_t::~Result_t((Result_t *)local_1b0);
        if (local_348[0] != local_338) {
          operator_delete(local_348[0],local_338[0] + 1);
        }
        iVar7._0_1_ = Options->error_flag;
        iVar7._1_1_ = Options->key_flag;
        iVar7._2_1_ = Options->read_hmac;
        iVar7._3_1_ = Options->split_wav;
        if (-1 < iVar7) {
          Kumu::FileWriter::Write((uchar *)local_1b0,(uint)local_1e8,local_308);
          Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_1b0);
          Kumu::Result_t::~Result_t((Result_t *)local_1b0);
        }
        Kumu::FileWriter::~FileWriter(local_1e8);
        iVar8._0_1_ = Options->error_flag;
        iVar8._1_1_ = Options->key_flag;
        iVar8._2_1_ = Options->read_hmac;
        iVar8._3_1_ = Options->split_wav;
        bVar18 = -1 < iVar8;
      }
      if ((!bVar18) || (uVar16 = uVar16 + 1, uVar17 <= uVar16)) break;
    }
  }
  ASDCP::FrameBuffer::~FrameBuffer(local_310);
  AS_02::ISXD::MXFReader::~MXFReader(local_358);
  return Options;
}

Assistant:

Result_t
read_isxd_file(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
  AESDecContext*     Context = 0;
  HMACContext*       HMAC = 0;
  AS_02::ISXD::MXFReader    Reader(fileReaderFactory);
  ASDCP::FrameBuffer  FrameBuffer;
  ui32_t             frame_count = 0;

  Result_t result = Reader.OpenRead(Options.input_filename);

  if ( ASDCP_SUCCESS(result) )
    {
      result = FrameBuffer.Capacity(Options.fb_size);
      frame_count = Reader.AS02IndexReader().GetDuration();
    }

  if ( ASDCP_SUCCESS(result) )
    {
      std::list<MXF::InterchangeObject*> object_list;
      Reader.OP1aHeader().GetMDObjectsByType(DefaultSMPTEDict().ul(MDD_GenericStreamTextBasedSet), object_list);

      std::list<MXF::InterchangeObject*>::iterator i;
      for ( i = object_list.begin(); i != object_list.end(); ++i )
	{
	  MXF::GenericStreamTextBasedSet *text_object = dynamic_cast<MXF::GenericStreamTextBasedSet*>(*i);
	  assert(text_object);
	  text_object->Dump(stderr);
	}
    }

#ifdef HAVE_OPENSSL
  if ( ASDCP_SUCCESS(result) && Options.key_flag )
    {
      Context = new AESDecContext;
      result = Context->InitKey(Options.key_value);

      if ( ASDCP_SUCCESS(result) && Options.read_hmac )
	{
	  WriterInfo Info;
	  Reader.FillWriterInfo(Info);

	  if ( Info.UsesHMAC )
	    {
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	  else
	    {
	      fputs("File does not contain HMAC values, ignoring -m option.\n", stderr);
	    }
	}
    }
#endif // HAVE_OPENSSL

  ui32_t last_frame = Options.start_frame + ( Options.duration ? Options.duration : frame_count);
  if ( last_frame > frame_count )
    last_frame = frame_count;

  char name_format[64];
  snprintf(name_format,  64, "%%s%%0%du.%s", Options.number_width, Options.extension);

  for ( ui32_t i = Options.start_frame; ASDCP_SUCCESS(result) && i < last_frame; i++ )
    {
      result = Reader.ReadFrame(i, FrameBuffer, Context, HMAC);

      if ( ASDCP_SUCCESS(result) )
	{
	  if ( ! Options.no_write_flag )
	    {
	      Kumu::FileWriter OutFile;
	      char filename[256];
	      ui32_t write_count;
	      snprintf(filename, 256, name_format, Options.file_prefix, i);
	      result = OutFile.OpenWrite(filename);

	      if ( ASDCP_SUCCESS(result) )
		result = OutFile.Write(FrameBuffer.Data(), FrameBuffer.Size(), &write_count);
	    }
	}
    }

  return result;
}